

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O2

int fy_fetch_key(fy_parser *fyp,int c)

{
  int indent;
  size_t sVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  fy_atom *pfVar5;
  fy_atom *pfVar6;
  fy_token *pfVar7;
  fy_atom *handle;
  uint uVar8;
  char *pcVar9;
  bool bVar10;
  fy_atom local_b8;
  undefined8 uStack_80;
  undefined1 local_78 [8];
  fy_simple_key_mark skm;
  
  pfVar5 = (fy_atom *)local_78;
  if (c == 0x3f) {
    if ((fyp->flow_level != 0) && (fyp->column <= fyp->indent)) {
      skm.required = true;
      skm._17_3_ = 0;
      skm.flow_level = 2;
      pfVar5 = fy_fill_atom_at(fyp,0,1,&local_b8);
      fy_token_create(FYTT_INPUT_MARKER,pfVar5);
      pcVar9 = "wrongly indented mapping key in flow mode";
LAB_0012c543:
      pfVar5 = &local_b8;
      fy_parser_diag_report(fyp,(fy_diag_report_ctx *)&skm.required,pcVar9);
      goto LAB_0012c550;
    }
    uStack_80 = 0x12c42a;
    fy_get_simple_key_mark(fyp,(fy_simple_key_mark *)local_78);
    sVar1 = fyp->current_input_pos;
    iVar4 = fyp->line;
    indent = fyp->column;
    pfVar5 = (fy_atom *)local_78;
    if (fyp->flow_level == 0) {
      if ((fyp->field_0x70 & 8) == 0) {
        skm.required = true;
        skm._17_3_ = 0;
        skm.flow_level = 2;
        pfVar5 = fy_fill_atom_at(fyp,0,1,&local_b8);
        fy_token_create(FYTT_INPUT_MARKER,pfVar5);
        pcVar9 = "invalid mapping key (not allowed in this context)";
        goto LAB_0012c543;
      }
      pfVar5 = (fy_atom *)local_78;
      if (fyp->indent < indent) {
        uStack_80 = 0x12c6c7;
        iVar3 = fy_push_indent(fyp,indent,true);
        if (iVar3 != 0) {
          pcVar9 = "fy_push_indent() failed";
          uStack_80 = 4;
          uVar8 = 4;
          iVar4 = 0x79a;
          pfVar5 = (fy_atom *)local_78;
          goto LAB_0012c495;
        }
        handle = &local_b8;
        pfVar5 = fy_fill_atom(fyp,0,handle);
        pfVar7 = fy_token_queue_internal(fyp,&fyp->queued_tokens,FYTT_BLOCK_MAPPING_START,pfVar5);
        pfVar5 = handle;
        if (pfVar7 == (fy_token *)0x0) {
          pcVar9 = "fy_token_queue_internal() failed";
          uVar8 = 4;
          iVar4 = 0x79f;
          goto LAB_0012c710;
        }
      }
    }
    *(undefined8 *)&pfVar5[-1].increment = 0x10;
    uVar2 = *(undefined8 *)&pfVar5[-1].increment;
    *(undefined8 *)&pfVar5[-1].increment = 0x12c44b;
    iVar3 = fy_remove_simple_key(fyp,(fy_token_type)uVar2);
    if (iVar3 == 0) {
      uVar8 = fyp->column;
      iVar3 = fyp->flow_level;
      fyp->pending_complex_key_column = uVar8;
      (fyp->pending_complex_key_mark).input_pos = sVar1;
      (fyp->pending_complex_key_mark).line = iVar4;
      (fyp->pending_complex_key_mark).column = indent;
      pfVar5[-1].fyi = (fy_input *)0x20;
      uVar2 = pfVar5[-1].fyi;
      pfVar5[-1].fyi = (fy_input *)(ulong)uVar8;
      pfVar5[-1].storage_hint = 0x12c5b9;
      fy_parser_diag(fyp,(uint)uVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                     ,0x7ab,"fy_fetch_key","pending_complex_key_column %d");
      handle = (fy_atom *)&pfVar5[-2].increment;
      pfVar5[-2].fyi = (fy_input *)0x1;
      uVar2 = pfVar5[-2].fyi;
      pfVar5[-2].fyi = (fy_input *)0x12c5ce;
      pfVar6 = fy_fill_atom(fyp,(int)uVar2,handle);
      pfVar5[-2].fyi = (fy_input *)0x10;
      uVar2 = pfVar5[-2].fyi;
      pfVar5[-2].fyi = (fy_input *)0x12c5de;
      pfVar7 = fy_token_queue(fyp,(fy_token_type)uVar2,pfVar6);
      if (pfVar7 == (fy_token *)0x0) {
        pcVar9 = "fy_token_queue() failed";
        pfVar5[-2].fyi = (fy_input *)0x4;
        uVar8 = (uint)pfVar5[-2].fyi;
        iVar4 = 0x7af;
LAB_0012c710:
        *(undefined8 *)&handle[-1].increment = 0x12c717;
        fy_parser_diag(fyp,uVar8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,iVar4,"fy_fetch_key",pcVar9);
        return 0;
      }
      bVar10 = iVar3 == 0;
      *(ushort *)&fyp->field_0x70 =
           ((ushort)*(undefined4 *)&fyp->field_0x70 & 0xfff7) + (ushort)bVar10 * 8;
      pcVar9 = "false";
      if (bVar10) {
        pcVar9 = "true";
      }
      pfVar5[-2].storage_hint = 0x20;
      uVar2 = pfVar5[-2].storage_hint;
      pfVar5[-2].storage_hint = (size_t)pcVar9;
      pfVar5[-2].end_mark.line = 0x12c63f;
      pfVar5[-2].end_mark.column = 0;
      fy_parser_diag(fyp,(uint)uVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                     ,0x7b2,"fy_fetch_key","simple_key_allowed -> %s\n");
      while( true ) {
        pfVar5[-2].fyi = (fy_input *)0x12c655;
        iVar4 = fy_parse_peek(fyp);
        if ((iVar4 != 9) && (iVar4 != 0x20)) break;
        pfVar5[-2].fyi = (fy_input *)0x12c64d;
        fy_advance(fyp,iVar4);
      }
      if (iVar4 != 0x23) {
        return 0;
      }
      pfVar5[-2].fyi = (fy_input *)0x12c67f;
      iVar4 = fy_scan_comment(fyp,pfVar7->comment + 1,false);
      if (iVar4 == 0) {
        return 0;
      }
      pcVar9 = "fy_scan_comment() failed";
      pfVar5[-2].fyi = (fy_input *)0x4;
      uVar8 = (uint)pfVar5[-2].fyi;
      iVar4 = 0x7bc;
      pfVar5 = (fy_atom *)&pfVar5[-2].increment;
    }
    else {
      pcVar9 = "fy_remove_simple_key() failed";
      *(undefined8 *)&pfVar5[-1].increment = 4;
      uVar8 = (uint)*(undefined8 *)&pfVar5[-1].increment;
      iVar4 = 0x7a4;
    }
  }
  else {
    pcVar9 = "illegal block entry or key mark";
    uStack_80 = 4;
    uVar8 = 4;
    iVar4 = 0x786;
  }
LAB_0012c495:
  *(undefined8 *)((long)pfVar5 + -8) = 0x12c49c;
  fy_parser_diag(fyp,uVar8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                 ,iVar4,"fy_fetch_key",pcVar9);
LAB_0012c550:
  *(undefined8 *)((long)pfVar5 + -8) = 0xffffffffffffffff;
  return (int)*(undefined8 *)((long)pfVar5 + -8);
}

Assistant:

int fy_fetch_key(struct fy_parser *fyp, int c) {
    int rc;
    struct fy_mark mark;
    struct fy_simple_key_mark skm;
    bool target_simple_key_allowed;
    struct fy_token *fyt;

    fyp_error_check(fyp, c == '?', err_out,
                    "illegal block entry or key mark");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp->flow_level || fyp->column > fyp->indent, err_out,
                          "wrongly indented mapping key in flow mode");

    fy_get_simple_key_mark(fyp, &skm);

    /* we have to save the start mark */
    fy_get_mark(fyp, &mark);

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          fyp->flow_level || fyp->simple_key_allowed, err_out,
                          "invalid mapping key (not allowed in this context)");

    if (!fyp->flow_level && fyp->indent < fyp->column) {

        /* push the new indent level */
        rc = fy_push_indent(fyp, fyp->column, true);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_push_indent() failed");

        fyt = fy_token_queue_internal(fyp, &fyp->queued_tokens,
                                      FYTT_BLOCK_MAPPING_START, fy_fill_atom_a(fyp, 0));
        fyp_error_check(fyp, fyt, err_out_rc,
                        "fy_token_queue_internal() failed");
    }

    rc = fy_remove_simple_key(fyp, FYTT_KEY);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_remove_simple_key() failed");

    target_simple_key_allowed = !fyp->flow_level;

    fyp->pending_complex_key_column = fyp->column;
    fyp->pending_complex_key_mark = mark;
    fyp_scan_debug(fyp, "pending_complex_key_column %d",
                   fyp->pending_complex_key_column);

    fyt = fy_token_queue(fyp, FYTT_KEY, fy_fill_atom_a(fyp, 1));
    fyp_error_check(fyp, fyt, err_out_rc,
                    "fy_token_queue() failed");

    fyp->simple_key_allowed = target_simple_key_allowed;
    fyp_scan_debug(fyp, "simple_key_allowed -> %s\n", fyp->simple_key_allowed ? "true" : "false");

    /* eat whitespace */
    while (fy_is_blank(c = fy_parse_peek(fyp)))
        fy_advance(fyp, c);

    /* comment? */
    if (c == '#') {
        rc = fy_scan_comment(fyp, &fyt->comment[fycp_right], false);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_scan_comment() failed");
    }

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    return rc;
}